

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

bool __thiscall ArgumentParser::ParseResult::MaybeReportError(ParseResult *this,cmMakefile *mf)

{
  bool bVar1;
  cmAlphaNum local_f0;
  cmAlphaNum local_b0;
  string local_80;
  reference local_60;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ke;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string e;
  cmMakefile *mf_local;
  ParseResult *this_local;
  
  e.field_2._8_8_ = mf;
  bVar1 = operator_cast_to_bool(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)&__range1);
    __end1 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->KeywordErrors);
    ke = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->KeywordErrors);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&ke);
      if (!bVar1) break;
      local_60 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end1);
      cmAlphaNum::cmAlphaNum(&local_b0,(string *)&__range1);
      cmAlphaNum::cmAlphaNum(&local_f0,"Error after keyword \"");
      cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string>
                (&local_80,&local_b0,&local_f0,&local_60->first,(char (*) [4])"\":\n",
                 &local_60->second);
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1);
    }
    cmMakefile::IssueMessage((cmMakefile *)e.field_2._8_8_,FATAL_ERROR,(string *)&__range1);
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)&__range1);
  }
  return this_local._7_1_;
}

Assistant:

bool ParseResult::MaybeReportError(cmMakefile& mf) const
{
  if (*this) {
    return false;
  }
  std::string e;
  for (auto const& ke : this->KeywordErrors) {
    e = cmStrCat(e, "Error after keyword \"", ke.first, "\":\n", ke.second);
  }
  mf.IssueMessage(MessageType::FATAL_ERROR, e);
  return true;
}